

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_memory.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateInt32Operand
          (ValidationState_t *_,Instruction *inst,uint32_t operand_index,char *opcode_name,
          char *operand_name)

{
  bool bVar1;
  uint id;
  uint32_t uVar2;
  Instruction *this;
  DiagnosticStream *pDVar3;
  string local_238;
  DiagnosticStream local_218;
  uint32_t local_3c;
  char *pcStack_38;
  uint32_t type_id;
  char *operand_name_local;
  char *opcode_name_local;
  Instruction *pIStack_20;
  uint32_t operand_index_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pcStack_38 = operand_name;
  operand_name_local = opcode_name;
  opcode_name_local._4_4_ = operand_index;
  pIStack_20 = (Instruction *)inst;
  inst_local = (Instruction *)_;
  id = val::Instruction::GetOperandAs<unsigned_int>((Instruction *)inst,(ulong)operand_index);
  this = ValidationState_t::FindDef(_,id);
  local_3c = val::Instruction::type_id(this);
  bVar1 = ValidationState_t::IsIntScalarType((ValidationState_t *)inst_local,local_3c);
  if ((bVar1) &&
     (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_3c),
     uVar2 == 0x20)) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    ValidationState_t::diag
              (&local_218,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
    pDVar3 = DiagnosticStream::operator<<(&local_218,&operand_name_local);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0xf43b35);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&stack0xffffffffffffffc8);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [12])0xf3fafe);
    ValidationState_t::getIdName_abi_cxx11_(&local_238,(ValidationState_t *)inst_local,local_3c);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_238);
    pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [26])" is not a 32 bit integer.");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    std::__cxx11::string::~string((string *)&local_238);
    DiagnosticStream::~DiagnosticStream(&local_218);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateInt32Operand(ValidationState_t& _, const Instruction* inst,
                                  uint32_t operand_index,
                                  const char* opcode_name,
                                  const char* operand_name) {
  const auto type_id =
      _.FindDef(inst->GetOperandAs<uint32_t>(operand_index))->type_id();
  if (!_.IsIntScalarType(type_id) || _.GetBitWidth(type_id) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << opcode_name << " " << operand_name << " type <id> "
           << _.getIdName(type_id) << " is not a 32 bit integer.";
  }
  return SPV_SUCCESS;
}